

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashSet.hpp
# Opt level: O2

Iterator __thiscall HashSet<String>::insert(HashSet<String> *this,Iterator *position,String *key)

{
  Item **ppIVar1;
  long lVar2;
  Item *pIVar3;
  Iterator this_00;
  void *buffer;
  undefined8 *puVar4;
  Item *pIVar5;
  usize uVar6;
  ulong uVar7;
  HashSet<String> *pHVar8;
  
  this_00 = find(this,key);
  if (this_00.item == *(Item **)this) {
    if (*(long *)(this + 0x20) == 0) {
      lVar2 = *(long *)(this + 0x18);
      buffer = operator_new__(lVar2 << 3);
      *(void **)(this + 0x20) = buffer;
      Memory::zero(buffer,lVar2 << 3);
    }
    this_00.item = *(Item **)(this + 0x70);
    if (this_00.item == (Item *)0x0) {
      puVar4 = (undefined8 *)operator_new__(0x128);
      *puVar4 = *(undefined8 *)(this + 0x78);
      *(undefined8 **)(this + 0x78) = puVar4;
      pIVar5 = (Item *)0x0;
      for (uVar7 = 0x50; uVar7 < 0x128; uVar7 = uVar7 + 0x48) {
        *(Item **)((long)puVar4 + uVar7 + 0x38) = pIVar5;
        pIVar5 = (Item *)((long)puVar4 + uVar7);
      }
      this_00.item = (Item *)(puVar4 + 1);
    }
    else {
      pIVar5 = (this_00.item)->prev;
    }
    *(Item **)(this + 0x70) = pIVar5;
    uVar6 = hash(key);
    String::String(&(this_00.item)->key,key);
    ppIVar1 = (Item **)(*(long *)(this + 0x20) + (uVar6 % *(ulong *)(this + 0x18)) * 8);
    (this_00.item)->cell = ppIVar1;
    pIVar5 = *ppIVar1;
    (this_00.item)->nextCell = pIVar5;
    if (pIVar5 != (Item *)0x0) {
      pIVar5->cell = &(this_00.item)->nextCell;
    }
    *ppIVar1 = this_00.item;
    pIVar5 = position->item;
    pIVar3 = pIVar5->prev;
    (this_00.item)->prev = pIVar3;
    pHVar8 = (HashSet<String> *)&pIVar3->next;
    if (pIVar3 == (Item *)0x0) {
      pHVar8 = this + 8;
    }
    *(Item **)pHVar8 = this_00.item;
    (this_00.item)->next = pIVar5;
    pIVar5->prev = this_00.item;
    *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
  }
  return (Iterator)this_00.item;
}

Assistant:

Iterator insert(const Iterator& position, const T& key)
  {
    Iterator it = find(key);
    if (it != _end) return it;

    if (!data)
    {
      data = (Item**)new char[sizeof(Item*) * capacity];
      Memory::zero(data, sizeof(Item*)* capacity);
    }

    Item* item;
    if (freeItem)
    {
      item = freeItem;
      freeItem = freeItem->prev;
    }
    else
    {
      ItemBlock* itemBlock = (ItemBlock*)new char[sizeof(ItemBlock) + sizeof(Item) * 4];
      itemBlock->next = blocks;
      blocks = itemBlock;
      item = (Item*)((char*)itemBlock + sizeof(ItemBlock));

      for (Item* i = item + 1, *end = item + 4; i < end; ++i)
      {
        i->prev = freeItem;
        freeItem = i;
      }
    }

    usize hashCode = hash(key);
#ifdef VERIFY
    VERIFY(new(item)Item(key) == item);
#else
    new(item)Item(key);
#endif

    Item** cell;
    item->cell = (cell = &data[hashCode % capacity]);
    if((item->nextCell = *cell))
      item->nextCell->cell = &item->nextCell;
    *cell = item;

    Item* insertPos = position.item;
    if ((item->prev = insertPos->prev))
      insertPos->prev->next = item;
    else
      _begin.item = item;

    item->next = insertPos;
    insertPos->prev = item;
    ++_size;
    return item;
  }